

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool google::protobuf::internal::MergeFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg,TcParseTableBase *tc_table,
               ParseFlags parse_flags)

{
  EpsCopyInputStream *this;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ushort *local_a0 [4];
  TcParseTableBase *in_stack_ffffffffffffff80;
  MessageLite *msg_00;
  
  this = (EpsCopyInputStream *)(local_a0 + 1);
  msg_00 = (MessageLite *)0x0;
  local_a0[0] = (ushort *)EpsCopyInputStream::InitFrom(this,input);
  do {
    bVar1 = EpsCopyInputStream::DoneWithCheck<false>(this,(char **)local_a0,-0x80000000);
    if (bVar1) break;
    uVar2 = (uint)tc_table->fast_idx_mask & (uint)*local_a0[0];
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_a0[0] = (ushort *)
                  (**(code **)(&tc_table[1].has_bits_offset + uVar3))
                            (msg,local_a0[0],this,
                             (ulong)*local_a0[0] ^
                             *(ulong *)(&tc_table[1].fast_idx_mask + uVar3 * 2),tc_table,0);
  } while (local_a0[0] != (ushort *)0x0);
  if ((tc_table->field_0x9 & 1) == 0) {
    if (local_a0[0] == (ushort *)0x0) {
      TcParser::VerifyHasBitConsistency(msg_00,in_stack_ffffffffffffff80);
    }
  }
  else {
    (*tc_table->post_loop_handler)(msg,(char *)local_a0[0],(ParseContext *)(local_a0 + 1));
  }
  return false;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has no explicit limit (hence we end on end of stream)
  if (ABSL_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}